

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scomplex.c
# Opt level: O3

void c_div(singlecomplex *c,singlecomplex *a,singlecomplex *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar7;
  singlecomplex sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  
  sVar4 = *b;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = sVar4.r;
  auVar10._4_4_ = sVar4.i;
  fVar13 = sVar4.r;
  fVar8 = sVar4.i;
  auVar9._0_8_ = (ulong)sVar4 ^ 0x8000000080000000;
  auVar9._8_4_ = 0x80000000;
  auVar9._12_4_ = 0x80000000;
  auVar10 = maxps(auVar9,auVar10);
  if (auVar10._0_4_ <= auVar10._4_4_) {
    if ((fVar8 == 0.0) && (!NAN(fVar8))) {
      c_div_cold_1();
      sVar4 = *c;
      auVar12._8_8_ = 0;
      auVar12._0_4_ = sVar4.r;
      auVar12._4_4_ = sVar4.i;
      auVar6._0_8_ = (ulong)sVar4 ^ 0x8000000080000000;
      auVar6._8_4_ = 0x80000000;
      auVar6._12_4_ = 0x80000000;
      maxps(auVar6,auVar12);
      return;
    }
    fVar13 = fVar13 / fVar8;
    fVar8 = (fVar13 * fVar13 + 1.0) * fVar8;
    fVar3 = (*a).r;
    fVar7 = (*a).i;
    auVar5._0_4_ = fVar13 * fVar3 + fVar7;
    auVar5._4_4_ = fVar13 * fVar7 + -fVar3;
    auVar5._8_4_ = fVar13 * 0.0 + fVar7;
    auVar5._12_4_ = fVar13 * 0.0 + fVar7;
    auVar2._4_4_ = fVar8;
    auVar2._0_4_ = fVar8;
    auVar2._8_4_ = fVar8;
    auVar2._12_4_ = fVar8;
    auVar10 = divps(auVar5,auVar2);
    sVar4 = auVar10._0_8_;
  }
  else {
    fVar8 = fVar8 / fVar13;
    fVar13 = (fVar8 * fVar8 + 1.0) * fVar13;
    fVar3 = (*a).r;
    fVar7 = (*a).i;
    auVar11._0_4_ = fVar8 * fVar7 + fVar3;
    auVar11._4_4_ = fVar8 * -fVar3 + fVar7;
    auVar11._8_4_ = fVar8 * fVar7 + 0.0;
    auVar11._12_4_ = fVar8 * fVar7 + 0.0;
    auVar1._4_4_ = fVar13;
    auVar1._0_4_ = fVar13;
    auVar1._8_4_ = fVar13;
    auVar1._12_4_ = fVar13;
    auVar10 = divps(auVar11,auVar1);
    sVar4 = auVar10._0_8_;
  }
  *c = sVar4;
  return;
}

Assistant:

void c_div(singlecomplex *c, const singlecomplex *a, const singlecomplex *b)
{
    float ratio, den;
    float abr, abi, cr, ci;
  
    if( (abr = b->r) < 0.)
	abr = - abr;
    if( (abi = b->i) < 0.)
	abi = - abi;
    if( abr <= abi ) {
	if (abi == 0) {
	    fprintf(stderr, "z_div.c: division by zero\n");
            exit(-1);
	}	  
	ratio = b->r / b->i ;
	den = b->i * (1 + ratio*ratio);
	cr = (a->r*ratio + a->i) / den;
	ci = (a->i*ratio - a->r) / den;
    } else {
	ratio = b->i / b->r ;
	den = b->r * (1 + ratio*ratio);
	cr = (a->r + a->i*ratio) / den;
	ci = (a->i - a->r*ratio) / den;
    }
    c->r = cr;
    c->i = ci;
}